

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * defaultAlloc(TidyAllocator *allocator,size_t size)

{
  void *pvVar1;
  
  if (g_malloc == (TidyMalloc)0x0) {
    pvVar1 = malloc(size);
  }
  else {
    pvVar1 = (*g_malloc)(size);
  }
  if (pvVar1 == (void *)0x0) {
    defaultPanic((TidyAllocator *)size,"Out of memory!");
  }
  return pvVar1;
}

Assistant:

static void* TIDY_CALL defaultAlloc( TidyAllocator* allocator, size_t size )
{
    void *p = ( g_malloc ? g_malloc(size) : malloc(size) );
    if ( !p )
        defaultPanic( allocator,"Out of memory!");
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_MEMORY)
    alloccnt++;
    SPRTF("%d: alloc   MEM %p, size %d\n", alloccnt, p, (int)size );
    if (size == 0) {
        SPRTF("NOTE: An allocation of ZERO bytes!!!!!!\n");
    }
#endif
    return p;
}